

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void save_column(int symbol,int default_state)

{
  int iVar1;
  Yshort *pYVar2;
  Yshort *pYVar3;
  long lVar4;
  int *piVar5;
  Yshort *pYVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  
  lVar4 = (long)symbol;
  iVar1 = goto_map[lVar4 + 1];
  iVar9 = 0;
  lVar10 = (long)goto_map[lVar4];
  for (lVar7 = lVar10; lVar7 < iVar1; lVar7 = lVar7 + 1) {
    iVar9 = iVar9 + (uint)(to_state[lVar7] != default_state);
  }
  if (iVar9 != 0) {
    lVar7 = (long)nstates * 3 + (long)symbol_value[lVar4];
    piVar5 = (int *)allocate(iVar9 * 4);
    froms[lVar7] = piVar5;
    pYVar6 = (Yshort *)allocate(iVar9 * 4);
    tos[lVar7] = pYVar6;
    pYVar3 = to_state;
    pYVar2 = from_state;
    piVar8 = piVar5;
    for (; lVar10 < iVar1; lVar10 = lVar10 + 1) {
      if (pYVar3[lVar10] != default_state) {
        *piVar8 = pYVar2[lVar10];
        piVar8 = piVar8 + 1;
        *pYVar6 = pYVar3[lVar10];
        pYVar6 = pYVar6 + 1;
      }
    }
    tally[lVar7] = iVar9;
    width[lVar7] = (piVar8[-1] - *piVar5) + 1;
  }
  return;
}

Assistant:

void save_column(int symbol, int default_state)
{
    register int i;
    register int m;
    register int n;
    register Yshort *sp;
    register Yshort *sp1;
    register Yshort *sp2;
    register int count;
    register int symno;

    m = goto_map[symbol];
    n = goto_map[symbol + 1];

    count = 0;
    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	    ++count;
    }
    if (count == 0) return;

    symno = symbol_value[symbol] + 3*nstates;

    froms[symno] = sp1 = sp = NEW2(count, Yshort);
    tos[symno] = sp2 = NEW2(count, Yshort);

    for (i = m; i < n; i++)
    {
	if (to_state[i] != default_state)
	{
	    *sp1++ = from_state[i];
	    *sp2++ = to_state[i];
	}
    }

    tally[symno] = count;
    width[symno] = sp1[-1] - sp[0] + 1;
}